

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void __thiscall
cfd::core::Psbt::SetTxInRecord(Psbt *this,uint32_t index,ByteData *key,ByteData *value)

{
  byte bVar1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  _func_int **pp_Var5;
  uint64_t __n;
  CfdException *pCVar6;
  long lVar7;
  size_t sVar8;
  wally_tx *pwVar9;
  undefined4 in_register_00000034;
  long lVar10;
  Transaction *this_00;
  wally_map *map_in;
  wally_psbt_input *parent;
  ulong __n_00;
  uint64_t uVar11;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey;
  allocator local_149;
  Transaction tx;
  vector<unsigned_char,_std::allocator<unsigned_char>_> val_vec;
  wally_tx_witness_stack *stack;
  pointer local_b8;
  wally_tx *wally_tx_obj;
  int local_a0;
  undefined4 uStack_9c;
  char *local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_vec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  
  (*this->_vptr_Psbt[2])(this,CONCAT44(in_register_00000034,index),0x9dd,"SetTxInRecord");
  pvVar2 = this->wally_psbt_pointer_;
  bVar3 = ByteData::IsEmpty(key);
  if (bVar3) {
    tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4f1c8e;
    tx.super_AbstractTransaction.wally_tx_pointer_ =
         (void *)CONCAT44(tx.super_AbstractTransaction.wally_tx_pointer_._4_4_,0x9e1);
    tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_42c9a7;
    logger::warn<>((CfdSourceLocation *)&tx,"psbt empty key error.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)&tx,"psbt empty key error.",(allocator *)&pubkey);
    CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::GetBytes(&key_vec,key);
  ByteData::GetBytes(&val_vec,value);
  lVar7 = (ulong)index * 0x110;
  parent = (wally_psbt_input *)(*(long *)((long)pvVar2 + 0x10) + lVar7);
  if (8 < *key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start) {
    ::std::__cxx11::string::string((string *)&tx,"input unknowns",(allocator *)&pubkey);
    FindPsbtMap(&parent->unknowns,&key_vec,(string *)&tx,(size_t *)0x0);
    ::std::__cxx11::string::~string((string *)&tx);
    ret = wally_map_add(&parent->unknowns,
                        key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)key_vec.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)key_vec.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                        val_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)val_vec.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)val_vec.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    if (ret != 0) {
      tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4f1c8e;
      tx.super_AbstractTransaction.wally_tx_pointer_ =
           (void *)CONCAT44(tx.super_AbstractTransaction.wally_tx_pointer_._4_4_,0x49f);
      tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_43c016;
      logger::warn<int&>((CfdSourceLocation *)&tx,"wally_map_add NG[{}]",&ret);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tx,"psbt add input unknowns error.",(allocator *)&pubkey);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    goto LAB_002e23dc;
  }
  lVar10 = (long)key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  switch(*key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
  case '\0':
    if (lVar10 != 1) {
      tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4f1c8e;
      tx.super_AbstractTransaction.wally_tx_pointer_ =
           (void *)CONCAT44(tx.super_AbstractTransaction.wally_tx_pointer_._4_4_,0x3df);
      tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_43c016;
      logger::warn<>((CfdSourceLocation *)&tx,"psbt invalid key format.");
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tx,"psbt invalid key format error.",(allocator *)&pubkey);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::ByteData((ByteData *)&pubkey,&val_vec);
    Transaction::Transaction(&tx,(ByteData *)&pubkey);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    wally_tx_obj = (wally_tx *)0x0;
    AbstractTransaction::GetHex_abi_cxx11_((string *)&pubkey,&tx.super_AbstractTransaction);
    ret = wally_tx_from_hex((char *)pubkey.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,0,&wally_tx_obj);
    ::std::__cxx11::string::~string((string *)&pubkey);
    if (ret != 0) {
      pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
      pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 999;
      pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = "SetPsbtInput";
      logger::warn<int&>((CfdSourceLocation *)&pubkey,"wally_tx_from_hex NG[{}]",&ret);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&pubkey,"psbt tx from hex error.",(allocator *)&stack);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&pubkey);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if ((wally_tx_obj->num_inputs == 0) || (wally_tx_obj->num_outputs == 0)) {
      wally_tx_free(wally_tx_obj);
      pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
      pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0x3ec;
      pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = "SetPsbtInput";
      logger::warn<>((CfdSourceLocation *)&pubkey,"invalind utxo transaction format.");
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)&pubkey,"psbt invalid tx error.",(allocator *)&stack)
      ;
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&pubkey);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ret = wally_psbt_input_set_utxo(parent,wally_tx_obj);
    wally_tx_free(wally_tx_obj);
    if (ret != 0) {
      pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
      pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0x3f3;
      pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = "SetPsbtInput";
      logger::warn<int&>((CfdSourceLocation *)&pubkey,"wally_psbt_input_set_utxo NG[{}]",&ret);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&pubkey,"psbt set input utxo error.",(allocator *)&stack);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&pubkey);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    Transaction::~Transaction(&tx);
    break;
  case '\x01':
    if (lVar10 != 1) {
      tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4f1c8e;
      tx.super_AbstractTransaction.wally_tx_pointer_ =
           (void *)CONCAT44(tx.super_AbstractTransaction.wally_tx_pointer_._4_4_,0x3f9);
      tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_43c016;
      logger::warn<>((CfdSourceLocation *)&tx,"psbt invalid key format.");
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tx,"psbt invalid key format error.",(allocator *)&pubkey);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    Deserializer::Deserializer((Deserializer *)&pubkey,&val_vec);
    pp_Var5 = (_func_int **)Deserializer::ReadUint64((Deserializer *)&pubkey);
    Deserializer::ReadVariableBuffer
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack,
               (Deserializer *)&pubkey);
    tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tx.super_AbstractTransaction.wally_tx_pointer_ = stack;
    tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(local_b8 + -(long)stack);
    tx.super_AbstractTransaction._vptr_AbstractTransaction = pp_Var5;
    ret = wally_psbt_input_set_witness_utxo(parent,(wally_tx_output *)&tx);
    if (ret != 0) {
      wally_tx_obj = (wally_tx *)0x4f1c8e;
      local_a0 = 0x408;
      local_98 = "SetPsbtInput";
      logger::warn<int&>((CfdSourceLocation *)&wally_tx_obj,
                         "wally_psbt_input_set_witness_utxo NG[{}]",&ret);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&wally_tx_obj,"psbt set output witnessUtxo error.",(allocator *)&pk_bytes
                );
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&wally_tx_obj);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&stack);
    this_00 = (Transaction *)&pubkey;
    goto LAB_002e23d7;
  case '\x02':
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey,lVar10 - 1,
               (allocator_type *)&tx);
    sVar8 = CONCAT44(pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish._4_4_,
                     pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish._0_4_) -
            (long)pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (sVar8 != 0) {
      memcpy(pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 1,sVar8);
    }
    ByteData::ByteData((ByteData *)&stack,&pubkey);
    Pubkey::Pubkey((Pubkey *)&wally_tx_obj,(ByteData *)&stack);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&stack);
    Pubkey::GetData((ByteData *)&tx,(Pubkey *)&wally_tx_obj);
    ByteData::GetBytes(&pk_bytes,(ByteData *)&tx);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tx);
    ::std::__cxx11::string::string((string *)&tx,"input signatures",(allocator *)&path);
    FindPsbtMap(&parent->signatures,&pk_bytes,(string *)&tx,(size_t *)0x0);
    ::std::__cxx11::string::~string((string *)&tx);
    ret = wally_map_add(&parent->signatures,
                        pk_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)pk_bytes.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)pk_bytes.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                        val_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)val_vec.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)val_vec.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    if (ret != 0) {
      tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4f1c8e;
      tx.super_AbstractTransaction.wally_tx_pointer_ =
           (void *)CONCAT44(tx.super_AbstractTransaction.wally_tx_pointer_._4_4_,0x419);
      tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_43c016;
      logger::warn<int&>((CfdSourceLocation *)&tx,"wally_map_add NG[{}]",&ret);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tx,"psbt set input signatures error.",(allocator *)&path);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    goto LAB_002e2108;
  case '\x03':
    if (lVar10 != 1) {
      tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4f1c8e;
      tx.super_AbstractTransaction.wally_tx_pointer_ =
           (void *)CONCAT44(tx.super_AbstractTransaction.wally_tx_pointer_._4_4_,0x41f);
      tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_43c016;
      logger::warn<>((CfdSourceLocation *)&tx,"psbt invalid key format.");
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tx,"psbt invalid key format error.",(allocator *)&pubkey);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if ((ulong)((long)val_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)val_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) < 4) {
      tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4f1c8e;
      tx.super_AbstractTransaction.wally_tx_pointer_ =
           (void *)CONCAT44(tx.super_AbstractTransaction.wally_tx_pointer_._4_4_,0x424);
      tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_43c016;
      logger::warn<>((CfdSourceLocation *)&tx,"psbt invalid value format.");
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tx,"psbt invalid value format error.",(allocator *)&pubkey);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ret = wally_psbt_input_set_sighash
                    (parent,*(uint32_t *)
                             val_vec.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    if (ret != 0) {
      tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4f1c8e;
      tx.super_AbstractTransaction.wally_tx_pointer_ =
           (void *)CONCAT44(tx.super_AbstractTransaction.wally_tx_pointer_._4_4_,0x42d);
      tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_43c016;
      logger::warn<int&>((CfdSourceLocation *)&tx,"wally_psbt_input_set_sighash NG[{}]",&ret);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tx,"psbt set input sighash error.",(allocator *)&pubkey);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    break;
  case '\x04':
    if (lVar10 != 1) {
      tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4f1c8e;
      tx.super_AbstractTransaction.wally_tx_pointer_ =
           (void *)CONCAT44(tx.super_AbstractTransaction.wally_tx_pointer_._4_4_,0x433);
      tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_43c016;
      logger::warn<>((CfdSourceLocation *)&tx,"psbt invalid key format.");
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tx,"psbt invalid key format error.",(allocator *)&pubkey);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ret = wally_psbt_input_set_redeem_script
                    (parent,val_vec.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                     (long)val_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)val_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_start);
    if (ret != 0) {
      tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4f1c8e;
      tx.super_AbstractTransaction.wally_tx_pointer_ =
           (void *)CONCAT44(tx.super_AbstractTransaction.wally_tx_pointer_._4_4_,0x43a);
      tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_43c016;
      logger::warn<int&>((CfdSourceLocation *)&tx,"wally_psbt_input_set_redeem_script NG[{}]",&ret);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tx,"psbt set input redeemScript error.",(allocator *)&pubkey);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    break;
  case '\x05':
    if (lVar10 != 1) {
      tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4f1c8e;
      tx.super_AbstractTransaction.wally_tx_pointer_ =
           (void *)CONCAT44(tx.super_AbstractTransaction.wally_tx_pointer_._4_4_,0x440);
      tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_43c016;
      logger::warn<>((CfdSourceLocation *)&tx,"psbt invalid key format.");
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tx,"psbt invalid key format error.",(allocator *)&pubkey);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ret = wally_psbt_input_set_witness_script
                    (parent,val_vec.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                     (long)val_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)val_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_start);
    if (ret != 0) {
      tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4f1c8e;
      tx.super_AbstractTransaction.wally_tx_pointer_ =
           (void *)CONCAT44(tx.super_AbstractTransaction.wally_tx_pointer_._4_4_,0x447);
      tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_43c016;
      logger::warn<int&>((CfdSourceLocation *)&tx,"wally_psbt_input_set_witness_script NG[{}]",&ret)
      ;
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tx,"psbt set input witnessScript error.",(allocator *)&pubkey);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    break;
  case '\x06':
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey,lVar10 - 1,
               (allocator_type *)&tx);
    sVar8 = CONCAT44(pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish._4_4_,
                     pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish._0_4_) -
            (long)pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (sVar8 != 0) {
      memcpy(pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 1,sVar8);
    }
    ByteData::ByteData((ByteData *)&stack,&pubkey);
    Pubkey::Pubkey((Pubkey *)&wally_tx_obj,(ByteData *)&stack);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&stack);
    Pubkey::GetData((ByteData *)&tx,(Pubkey *)&wally_tx_obj);
    ByteData::GetBytes(&pk_bytes,(ByteData *)&tx);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tx);
    ::std::__cxx11::string::string((string *)&tx,"input bip32 pubkey",(allocator *)&path);
    FindPsbtMap(&parent->keypaths,&pk_bytes,(string *)&tx,(size_t *)0x0);
    ::std::__cxx11::string::~string((string *)&tx);
    if ((ulong)((long)val_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)val_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) < 4) {
      tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4f1c8e;
      tx.super_AbstractTransaction.wally_tx_pointer_ =
           (void *)CONCAT44(tx.super_AbstractTransaction.wally_tx_pointer_._4_4_,0x455);
      tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_43c016;
      logger::warn<>((CfdSourceLocation *)&tx,"psbt invalid value format.");
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tx,"psbt invalid value format error.",(allocator *)&path);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    __n_00 = ((long)val_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)val_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   .super__Vector_impl_data._M_start) - 4;
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&path,__n_00 >> 2,(allocator_type *)&tx);
    if (__n_00 != 0) {
      memcpy(path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             val_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 4,__n_00);
    }
    ret = wally_map_add_keypath_item
                    (&parent->keypaths,
                     pk_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)pk_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)pk_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                     val_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,4,
                     path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long)path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 2);
    if (ret != 0) {
      tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4f1c8e;
      tx.super_AbstractTransaction.wally_tx_pointer_ =
           (void *)CONCAT44(tx.super_AbstractTransaction.wally_tx_pointer_._4_4_,0x463);
      tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_43c016;
      logger::warn<int&>((CfdSourceLocation *)&tx,"wally_map_add_keypath_item NG[{}]",&ret);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)&tx,"psbt set input pubkey error.",&local_149);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
LAB_002e2108:
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&pk_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&wally_tx_obj);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    break;
  case '\a':
    if (lVar10 != 1) {
      tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4f1c8e;
      tx.super_AbstractTransaction.wally_tx_pointer_ =
           (void *)CONCAT44(tx.super_AbstractTransaction.wally_tx_pointer_._4_4_,0x469);
      tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_43c016;
      logger::warn<>((CfdSourceLocation *)&tx,"psbt invalid key format.");
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tx,"psbt invalid key format error.",(allocator *)&pubkey);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ret = wally_psbt_input_set_final_scriptsig
                    (parent,val_vec.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                     (long)val_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)val_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_start);
    if (ret != 0) {
      tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4f1c8e;
      tx.super_AbstractTransaction.wally_tx_pointer_ =
           (void *)CONCAT44(tx.super_AbstractTransaction.wally_tx_pointer_._4_4_,0x470);
      tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_43c016;
      logger::warn<int&>((CfdSourceLocation *)&tx,"wally_psbt_input_set_final_scriptsig NG[{}]",&ret
                        );
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tx,"psbt set input final scriptsig error.",(allocator *)&pubkey);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    break;
  case '\b':
    if (lVar10 != 1) {
      tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4f1c8e;
      tx.super_AbstractTransaction.wally_tx_pointer_ =
           (void *)CONCAT44(tx.super_AbstractTransaction.wally_tx_pointer_._4_4_,0x476);
      tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_43c016;
      logger::warn<>((CfdSourceLocation *)&tx,"psbt invalid key format.");
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tx,"psbt invalid key format error.",(allocator *)&pubkey);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    Deserializer::Deserializer((Deserializer *)&tx,&val_vec);
    __n = Deserializer::ReadVariableInt((Deserializer *)&tx);
    ::std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)&wally_tx_obj,__n,(allocator_type *)&pubkey);
    lVar10 = 0;
    uVar11 = __n;
    while (bVar3 = uVar11 != 0, uVar11 = uVar11 - 1, bVar3) {
      Deserializer::ReadVariableBuffer
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                 (Deserializer *)&tx);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ((long)&wally_tx_obj->version + lVar10),
                 &pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      lVar10 = lVar10 + 0x18;
    }
    stack = (wally_tx_witness_stack *)0x0;
    ret = wally_tx_witness_stack_init_alloc(__n,&stack);
    if (ret != 0) {
      pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
      pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0x484;
      pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = "SetPsbtInput";
      logger::warn<int&>((CfdSourceLocation *)&pubkey,"wally_tx_witness_stack_init_alloc NG[{}]",
                         &ret);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&pubkey,"psbt alloc witness stack error.",(allocator *)&pk_bytes);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&pubkey);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ret = 0;
    pwVar9 = wally_tx_obj;
    while (pwVar9 != (wally_tx *)CONCAT44(uStack_9c,local_a0)) {
      ret = wally_tx_witness_stack_add
                      (stack,*(uchar **)pwVar9,(long)pwVar9->inputs - (long)*(uchar **)pwVar9);
      pwVar9 = (wally_tx *)&pwVar9->inputs_allocation_len;
      if (ret != 0) {
        wally_tx_witness_stack_free(stack);
        pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
        pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0x48d;
        pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = "SetPsbtInput";
        logger::warn<int&>((CfdSourceLocation *)&pubkey,"wally_tx_witness_stack_add NG[{}]",&ret);
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&pubkey,"psbt add witness stack error.",(allocator *)&pk_bytes);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&pubkey);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    ret = wally_psbt_input_set_final_witness(parent,stack);
    wally_tx_witness_stack_free(stack);
    if (ret != 0) {
      pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
      pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0x495;
      pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = "SetPsbtInput";
      logger::warn<int&>((CfdSourceLocation *)&pubkey,"wally_psbt_input_set_final_witness NG[{}]",
                         &ret);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&pubkey,"psbt set input final witnessStack error.",(allocator *)&pk_bytes
                );
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&pubkey);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)&wally_tx_obj);
    this_00 = &tx;
LAB_002e23d7:
    Deserializer::~Deserializer((Deserializer *)this_00);
  }
LAB_002e23dc:
  bVar1 = *key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (bVar1 < 9) {
    if (bVar1 == 6) {
      map_in = (wally_map *)(*(long *)((long)pvVar2 + 0x10) + lVar7 + 0x48);
    }
    else {
      if (bVar1 != 2) goto LAB_002e2461;
      map_in = (wally_map *)(*(long *)((long)pvVar2 + 0x10) + lVar7 + 0x60);
    }
  }
  else {
    map_in = (wally_map *)(*(long *)((long)pvVar2 + 0x10) + lVar7 + 0x78);
  }
  iVar4 = wally_map_sort(map_in,0);
  pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,iVar4);
  if (iVar4 != 0) {
    tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4f1c8e;
    tx.super_AbstractTransaction.wally_tx_pointer_ =
         (void *)CONCAT44(tx.super_AbstractTransaction.wally_tx_pointer_._4_4_,0x9f6);
    tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_42c9a7;
    logger::warn<int&>((CfdSourceLocation *)&tx,"wally_map_sort NG[{}]",(int *)&pubkey);
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&tx,"psbt input sort unknowns error.",(allocator *)&wally_tx_obj);
    CfdException::CfdException(pCVar6,kCfdInternalError,(string *)&tx);
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
LAB_002e2461:
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&val_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void Psbt::SetTxInRecord(
    uint32_t index, const ByteData &key, const ByteData &value) {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  if (key.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "psbt empty key error.");
    throw CfdException(kCfdIllegalArgumentError, "psbt empty key error.");
  }

  auto key_vec = key.GetBytes();
  auto val_vec = value.GetBytes();
  uint8_t type = SetPsbtInput(key_vec, val_vec, &psbt_pointer->inputs[index]);

  struct wally_map *map_ptr = nullptr;
  if (type <= Psbt::kPsbtInputFinalScriptWitness) {
    if (type == Psbt::kPsbtInputPartialSig) {
      map_ptr = &psbt_pointer->inputs[index].signatures;
    } else if (type == Psbt::kPsbtInputBip32Derivation) {
      map_ptr = &psbt_pointer->inputs[index].keypaths;
    }
  } else {
    map_ptr = &psbt_pointer->inputs[index].unknowns;
  }
  if (map_ptr != nullptr) {
    int ret = wally_map_sort(map_ptr, 0);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_sort NG[{}]", ret);
      throw CfdException(kCfdInternalError, "psbt input sort unknowns error.");
    }
  }
}